

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrRequestExitSession(XrSession session)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_24;
  LoaderInstance *pLStack_20;
  XrResult result;
  LoaderInstance *loader_instance;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)session;
  local_24 = ActiveLoaderInstance::Get(&stack0xffffffffffffffe0,"xrRequestExitSession");
  if (XR_ERROR_VALIDATION_FAILURE < local_24) {
    this = LoaderInstance::DispatchTable(pLStack_20);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_24 = (*pXVar1->RequestExitSession)((XrSession)loader_instance);
  }
  return local_24;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrRequestExitSession(
    XrSession                                   session) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrRequestExitSession");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->RequestExitSession(session);
    }
    return result;
}